

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomSizeF::read(DomSizeF *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  double dVar4;
  QLatin1StringView QVar5;
  QStringView tag;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffef8;
  QLatin1String *a;
  undefined2 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0a;
  byte in_stack_ffffffffffffff0b;
  QLatin1String *pQVar6;
  DomSizeF *pDVar7;
  storage_type_conflict *in_stack_ffffffffffffff28;
  bool local_98 [64];
  bool local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QLatin1String *)CONCAT44(in_register_00000034,__fd);
  pDVar7 = this;
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1c1c2a);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001c1e5e;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,
                 (QString *)
                 CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                         CONCAT12(in_stack_ffffffffffffff0a,
                                                  in_stack_ffffffffffffff08))));
      other.m_data = in_stack_ffffffffffffff28;
      other.m_size = (qsizetype)pDVar7;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffef8,other,CaseInsensitive);
      in_stack_ffffffffffffff0b = iVar3 != 0 ^ 0xff;
      QString::~QString((QString *)0x1c1cfc);
      if ((in_stack_ffffffffffffff0b & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)this,
                   (QString *)
                   CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                    in_stack_ffffffffffffff08))));
        other_00.m_data = in_stack_ffffffffffffff28;
        other_00.m_size = (qsizetype)pDVar7;
        iVar3 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffef8,other_00,CaseInsensitive);
        in_stack_ffffffffffffff0a = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1c1dad);
        if ((in_stack_ffffffffffffff0a & 1) == 0) {
          pQVar6 = a;
          QVar5 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffff0b,
                                                             CONCAT12(in_stack_ffffffffffffff0a,
                                                                      in_stack_ffffffffffffff08))),
                             (size_t)a);
          in_stack_ffffffffffffff28 = (storage_type_conflict *)QVar5.m_size;
          ::operator+(a,(QStringView *)in_stack_fffffffffffffef8);
          ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffef8);
          QXmlStreamReader::raiseError((QString *)a);
          QString::~QString((QString *)0x1c1e53);
          a = pQVar6;
        }
        else {
          QXmlStreamReader::readElementText(local_98,a,0);
          dVar4 = (double)QString::toDouble(local_98);
          setElementHeight(this,dVar4);
          QString::~QString((QString *)0x1c1dea);
        }
      }
      else {
        QXmlStreamReader::readElementText(local_58,a,0);
        dVar4 = (double)QString::toDouble(local_58);
        setElementWidth(this,dVar4);
        QString::~QString((QString *)0x1c1d42);
      }
    }
  } while (iVar2 != 5);
LAB_001c1e5e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomSizeF::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"width"_s, Qt::CaseInsensitive)) {
                setElementWidth(reader.readElementText().toDouble());
                continue;
            }
            if (!tag.compare(u"height"_s, Qt::CaseInsensitive)) {
                setElementHeight(reader.readElementText().toDouble());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}